

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::mergeBlockDefinitions(TInfoSink&,glslang::TIntermSymbol*,glslang::
TIntermSymbol*,glslang::TIntermediate*)::TMergeBlockTraverser::visitBinary(glslang::TVisit,glslang::
TIntermBinary__(void *this,TVisit param_1,TIntermBinary *node)

{
  uint u;
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TType *this_01;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  long *plVar4;
  mapped_type_conflict *pmVar5;
  undefined4 extraout_var_02;
  TSourceLoc *loc;
  TIntermConstantUnion *pTVar6;
  undefined4 in_register_00000034;
  uint memberIdx;
  key_type_conflict local_24;
  
  if ((((*(long *)((long)this + 0x48) != 0) && (*(long *)((long)this + 0x40) != 0)) &&
      (*(long *)((long)this + 0x50) != 0)) &&
     ((*(long *)(*(long *)((long)this + 0x50) + 0x28) != 0 &&
      ((node->super_TIntermOperator).op == EOpIndexDirectStruct)))) {
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node,CONCAT44(in_register_00000034,param_1));
    this_01 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
                                 ((long *)CONCAT44(extraout_var,iVar2));
    bVar1 = TType::operator==(this_01,*(TType **)((long)this + 0x40));
    if (bVar1) {
      iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_00,iVar2));
      if (lVar3 == 0) {
        __assert_fail("node->getRight()->getAsConstantUnion()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x314,
                      "virtual bool glslang::TIntermediate::mergeBlockDefinitions(TInfoSink &, TIntermSymbol *, TIntermSymbol *, TIntermediate *)::TMergeBlockTraverser::visitBinary(TVisit, glslang::TIntermBinary *)"
                     );
      }
      iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                                 ((long *)CONCAT44(extraout_var_01,iVar2));
      pmVar5 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::at(*(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      **)((long)this + 0x50),&local_24);
      u = *pmVar5;
      this_00 = *(TIntermediate **)((long)this + 0x48);
      iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      loc = (TSourceLoc *)
            (*(code *)**(undefined8 **)CONCAT44(extraout_var_02,iVar2))
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar2));
      pTVar6 = addConstantUnion(this_00,u,loc,false);
      (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
                (node,pTVar6);
      (**(code **)(*plVar4 + 0xe0))(plVar4);
    }
  }
  return true;
}

Assistant:

virtual bool visitBinary(TVisit, glslang::TIntermBinary* node)
        {
            if (!unit || !newType || !memberIndexUpdates || memberIndexUpdates->empty())
                return true;

            if (node->getOp() == EOpIndexDirectStruct && node->getLeft()->getType() == *newType) {
                // this is a dereference to a member of the block since the
                // member list changed, need to update this to point to the
                // right index
                assert(node->getRight()->getAsConstantUnion());

                glslang::TIntermConstantUnion* constNode = node->getRight()->getAsConstantUnion();
                unsigned int memberIdx = constNode->getConstArray()[0].getUConst();
                unsigned int newIdx = memberIndexUpdates->at(memberIdx);
                TIntermTyped* newConstNode = unit->addConstantUnion(newIdx, node->getRight()->getLoc());

                node->setRight(newConstNode);
                delete constNode;

                return true;
            }
            return true;
        }